

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_queue_count.cpp
# Opt level: O3

int main(void)

{
  istream *this;
  ostream *poVar1;
  int iVar2;
  int a;
  int k;
  int n;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_d4;
  int local_d0;
  int local_cc;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  _Deque_base<int,_std::allocator<int>_> local_70;
  
  iVar2 = 0;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105190) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_cc);
  std::istream::operator>>(this,&local_d0);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
  if (0 < local_cc) {
    do {
      std::istream::operator>>((istream *)&std::cin,&local_d4);
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_c8,&local_d4);
      }
      else {
        *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d4;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_cc);
  }
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)&local_70,
             (deque<int,_std::allocator<int>_> *)&local_c8);
  qcount((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_70,local_d0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_70);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
  return 0;
}

Assistant:

int main() {
    // for faster cin, cout
    ios_base::sync_with_stdio(false);
    cin.tie(0);
    int n, k;
    cin >> n >> k;
    queue<int> q;
    for (int i = 0; i < n; i++) {
        int a;
        cin >> a;
        q.push(a);
    }
    cout << qcount(q, k) << endl;
}